

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

_Bool Curl_auth_digest_get_pair(char *str,char *value,char *content,char **endptr)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  byte *pbVar4;
  long lVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  bool bVar10;
  char *pcVar5;
  
  lVar6 = 0;
  for (lVar8 = 0; ((cVar1 = str[lVar8], cVar1 != '\0' && (cVar1 != '=')) && ((int)lVar8 != 0xff));
      lVar8 = lVar8 + 1) {
    value[lVar8] = cVar1;
    lVar6 = lVar6 + -1;
  }
  value[lVar8] = '\0';
  cVar1 = str[lVar8];
  if (cVar1 == '=') {
    cVar2 = str[lVar8 + 1];
    pcVar5 = str + 2;
    if (cVar2 != '\"') {
      pcVar5 = str + 1;
    }
    pbVar4 = (byte *)(pcVar5 + -lVar6);
    bVar9 = *pbVar4;
    if (bVar9 != 0) {
      iVar7 = 0x3ff;
      bVar3 = false;
      do {
        bVar10 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if (bVar10) break;
        if (bVar9 < 0x22) {
          if ((bVar9 != 10) && (bVar9 != 0xd)) goto LAB_001302a0;
LAB_00130288:
          iVar7 = 0;
        }
        else {
          if (bVar9 == 0x22) {
            if ((bool)(cVar2 == '\"' & (bVar3 ^ 1U))) goto LAB_00130288;
LAB_001302a0:
            bVar3 = false;
          }
          else {
            if (bVar9 == 0x2c) {
              if (cVar2 != '\"') goto LAB_00130288;
              goto LAB_001302a0;
            }
            if ((bVar9 != 0x5c) || (bVar3)) goto LAB_001302a0;
            bVar3 = true;
            bVar9 = 0x5c;
          }
          *content = bVar9;
          content = (char *)((byte *)content + 1);
        }
        bVar9 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while (bVar9 != 0);
    }
    *content = 0;
    *endptr = (char *)pbVar4;
  }
  return cVar1 == '=';
}

Assistant:

bool Curl_auth_digest_get_pair(const char *str, char *value, char *content,
                               const char **endptr)
{
  int c;
  bool starts_with_quote = FALSE;
  bool escape = FALSE;

  for(c = DIGEST_MAX_VALUE_LENGTH - 1; (*str && (*str != '=') && c--);)
    *value++ = *str++;
  *value = 0;

  if('=' != *str++)
    /* eek, no match */
    return FALSE;

  if('\"' == *str) {
    /* This starts with a quote so it must end with one as well! */
    str++;
    starts_with_quote = TRUE;
  }

  for(c = DIGEST_MAX_CONTENT_LENGTH - 1; *str && c--; str++) {
    switch(*str) {
    case '\\':
      if(!escape) {
        /* possibly the start of an escaped quote */
        escape = TRUE;
        *content++ = '\\'; /* Even though this is an escape character, we still
                              store it as-is in the target buffer */
        continue;
      }
      break;

    case ',':
      if(!starts_with_quote) {
        /* This signals the end of the content if we didn't get a starting
           quote and then we do "sloppy" parsing */
        c = 0; /* the end */
        continue;
      }
      break;

    case '\r':
    case '\n':
      /* end of string */
      c = 0;
      continue;

    case '\"':
      if(!escape && starts_with_quote) {
        /* end of string */
        c = 0;
        continue;
      }
      break;
    }

    escape = FALSE;
    *content++ = *str;
  }

  *content = 0;
  *endptr = str;

  return TRUE;
}